

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::access_potential_resource
          (InterlockedResourceAccessHandler *this,uint32_t id)

{
  uint32_t local_14;
  InterlockedResourceAccessHandler *pIStack_10;
  uint32_t id_local;
  InterlockedResourceAccessHandler *this_local;
  
  if (((((this->use_critical_section & 1U) != 0) && ((this->in_crit_sec & 1U) != 0)) ||
      (((this->control_flow_interlock & 1U) != 0 && ((this->call_stack_is_interlocked & 1U) != 0))))
     || ((this->split_function_case & 1U) != 0)) {
    local_14 = id;
    pIStack_10 = this;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->compiler->interlocked_resources,&local_14);
  }
  return;
}

Assistant:

void Compiler::InterlockedResourceAccessHandler::access_potential_resource(uint32_t id)
{
	if ((use_critical_section && in_crit_sec) || (control_flow_interlock && call_stack_is_interlocked) ||
	    split_function_case)
	{
		compiler.interlocked_resources.insert(id);
	}
}